

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppnet.cpp
# Opt level: O2

void __thiscall cppnet::CppNet::~CppNet(CppNet *this)

{
  CppNetBase *this_00;
  
  this_00 = (this->_cppnet_base).super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_00 != (CppNetBase *)0x0) {
    CppNetBase::Dealloc(this_00);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_cppnet_base).
              super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

CppNet::~CppNet() {
    if (_cppnet_base) {
        _cppnet_base->Dealloc();
    }
}